

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O1

int32_t icu_63::number::impl::SimpleModifier::formatTwoArgPattern
                  (SimpleFormatter *compiled,NumberStringBuilder *result,int32_t index,
                  int32_t *outPrefixLength,int32_t *outSuffixLength,Field field,UErrorCode *status)

{
  UnicodeString *unistr;
  ushort uVar1;
  short sVar2;
  char16_t *pcVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  char16_t cVar7;
  int iVar8;
  int iVar9;
  
  uVar1 = (compiled->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar3 = (compiled->compiledPattern).fUnion.fFields.fArray;
    }
    else {
      pcVar3 = (compiled->compiledPattern).fUnion.fStackFields.fBuffer;
    }
  }
  else {
    pcVar3 = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    iVar9 = (compiled->compiledPattern).fUnion.fFields.fLength;
  }
  else {
    iVar9 = (int)(short)uVar1 >> 5;
  }
  if ((iVar9 == 0) || (*pcVar3 != L'\x02')) {
    *status = U_INTERNAL_PROGRAM_ERROR;
    iVar9 = 0;
  }
  else {
    cVar7 = L'\xffff';
    if (iVar9 != 1) {
      if ((uVar1 & 2) == 0) {
        pcVar3 = (compiled->compiledPattern).fUnion.fFields.fArray;
      }
      else {
        pcVar3 = (char16_t *)((long)&(compiled->compiledPattern).fUnion + 2);
      }
      cVar7 = pcVar3[1];
    }
    unistr = &compiled->compiledPattern;
    if ((ushort)cVar7 < 0x100) {
      iVar8 = 0;
      uVar5 = 2;
    }
    else {
      iVar8 = (ushort)cVar7 - 0x100;
      NumberStringBuilder::insert(result,index,unistr,2,(ushort)cVar7 - 0xfe,field,status);
      uVar5 = (ushort)cVar7 - 0xfd;
    }
    sVar2 = (compiled->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      uVar4 = (compiled->compiledPattern).fUnion.fFields.fLength;
    }
    else {
      uVar4 = (int)sVar2 >> 5;
    }
    cVar7 = L'\xffff';
    if (uVar5 < uVar4) {
      if (((int)sVar2 & 2U) == 0) {
        pcVar3 = (compiled->compiledPattern).fUnion.fFields.fArray;
      }
      else {
        pcVar3 = (char16_t *)((long)&(compiled->compiledPattern).fUnion + 2);
      }
      cVar7 = pcVar3[(int)uVar5];
    }
    uVar5 = uVar5 + 1;
    iVar9 = iVar8;
    if (0xff < (ushort)cVar7) {
      NumberStringBuilder::insert
                (result,iVar8 + index,unistr,uVar5,uVar5 + (ushort)cVar7 + -0x100,field,status);
      uVar5 = (uVar5 + (ushort)cVar7) - 0xff;
      iVar9 = iVar8 + (uint)(ushort)cVar7 + -0x100;
    }
    sVar2 = (compiled->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      uVar4 = (compiled->compiledPattern).fUnion.fFields.fLength;
    }
    else {
      uVar4 = (int)sVar2 >> 5;
    }
    iVar6 = 0;
    if (uVar5 != uVar4) {
      iVar6 = 0xfeff;
      if (uVar5 < uVar4) {
        if (((int)sVar2 & 2U) == 0) {
          pcVar3 = (compiled->compiledPattern).fUnion.fFields.fArray;
        }
        else {
          pcVar3 = (char16_t *)((long)&(compiled->compiledPattern).fUnion + 2);
        }
        iVar6 = (ushort)pcVar3[(int)uVar5] - 0x100;
      }
      NumberStringBuilder::insert
                (result,index + iVar9,unistr,uVar5 + 1,uVar5 + iVar6 + 1,field,status);
      iVar9 = iVar9 + iVar6;
    }
    *outPrefixLength = iVar8;
    *outSuffixLength = iVar6;
  }
  return iVar9;
}

Assistant:

int32_t
SimpleModifier::formatTwoArgPattern(const SimpleFormatter& compiled, NumberStringBuilder& result,
                                    int32_t index, int32_t* outPrefixLength, int32_t* outSuffixLength,
                                    Field field, UErrorCode& status) {
    const UnicodeString& compiledPattern = compiled.compiledPattern;
    int32_t argLimit = SimpleFormatter::getArgumentLimit(
            compiledPattern.getBuffer(), compiledPattern.length());
    if (argLimit != 2) {
        status = U_INTERNAL_PROGRAM_ERROR;
        return 0;
    }
    int32_t offset = 1; // offset into compiledPattern
    int32_t length = 0; // chars added to result

    int32_t prefixLength = compiledPattern.charAt(offset);
    offset++;
    if (prefixLength < ARG_NUM_LIMIT) {
        // No prefix
        prefixLength = 0;
    } else {
        prefixLength -= ARG_NUM_LIMIT;
        result.insert(index + length, compiledPattern, offset, offset + prefixLength, field, status);
        offset += prefixLength;
        length += prefixLength;
        offset++;
    }

    int32_t infixLength = compiledPattern.charAt(offset);
    offset++;
    if (infixLength < ARG_NUM_LIMIT) {
        // No infix
        infixLength = 0;
    } else {
        infixLength -= ARG_NUM_LIMIT;
        result.insert(index + length, compiledPattern, offset, offset + infixLength, field, status);
        offset += infixLength;
        length += infixLength;
        offset++;
    }

    int32_t suffixLength;
    if (offset == compiledPattern.length()) {
        // No suffix
        suffixLength = 0;
    } else {
        suffixLength = compiledPattern.charAt(offset) -  ARG_NUM_LIMIT;
        offset++;
        result.insert(index + length, compiledPattern, offset, offset + suffixLength, field, status);
        length += suffixLength;
    }

    *outPrefixLength = prefixLength;
    *outSuffixLength = suffixLength;

    return length;
}